

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.cc
# Opt level: O0

string * google::protobuf::TestTempDir_abi_cxx11_(void)

{
  string *in_RDI;
  
  (anonymous_namespace)::TempDirDeleter::GetTempDir_abi_cxx11_
            (in_RDI,(anonymous_namespace)::temp_dir_deleter_);
  return in_RDI;
}

Assistant:

std::string TestTempDir() { return temp_dir_deleter_.GetTempDir(); }